

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGen.cxx
# Opt level: O1

string * cmQtAutoGen::Quoted(string *__return_storage_ptr__,string *text)

{
  pointer pcVar1;
  array<std::pair<const_char_*,_const_char_*>,_9UL> *__range1;
  long lVar2;
  array<std::pair<const_char_*,_const_char_*>,_9UL> replaces;
  char *apcStack_d0 [19];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  apcStack_d0[1] = "\\";
  apcStack_d0[2] = "\\\\";
  apcStack_d0[3] = "\"";
  apcStack_d0[4] = "\\\"";
  apcStack_d0[5] = "\a";
  apcStack_d0[6] = "\\a";
  apcStack_d0[7] = anon_var_dwarf_17f9541 + 2;
  apcStack_d0[8] = "\\b";
  apcStack_d0[9] = "\f";
  apcStack_d0[10] = "\\f";
  apcStack_d0[0xb] = "\n";
  apcStack_d0[0xc] = "\\n";
  apcStack_d0[0xd] = "\r";
  apcStack_d0[0xe] = "\\r";
  apcStack_d0[0xf] = "\t";
  apcStack_d0[0x10] = "\\t";
  apcStack_d0[0x11] = "\v";
  apcStack_d0[0x12] = "\\v";
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (text->_M_dataplus)._M_p;
  apcStack_d0[0] = (char *)0x3cc259;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + text->_M_string_length);
  lVar2 = 8;
  do {
    apcStack_d0[0] = (char *)0x3cc270;
    cmsys::SystemTools::ReplaceString
              (__return_storage_ptr__,*(char **)((long)apcStack_d0 + lVar2),
               *(char **)((long)apcStack_d0 + lVar2 + 8));
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x98);
  apcStack_d0[0] = (char *)0x3cc292;
  std::operator+(&local_38,'\"',__return_storage_ptr__);
  apcStack_d0[0] = (char *)0x3cc2a5;
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    apcStack_d0[0] = (char *)0x3cc2c5;
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  apcStack_d0[0] = (char *)0x3cc2d2;
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGen::Quoted(std::string const& text)
{
  const std::array<std::pair<const char*, const char*>, 9> replaces = {
    { { "\\", "\\\\" },
      { "\"", "\\\"" },
      { "\a", "\\a" },
      { "\b", "\\b" },
      { "\f", "\\f" },
      { "\n", "\\n" },
      { "\r", "\\r" },
      { "\t", "\\t" },
      { "\v", "\\v" } }
  };

  std::string res = text;
  for (auto const& pair : replaces) {
    cmSystemTools::ReplaceString(res, pair.first, pair.second);
  }
  res = '"' + res;
  res += '"';
  return res;
}